

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O2

string * __thiscall
QAV<QBGPlanner_TreeIncPruneBnB>::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,QAV<QBGPlanner_TreeIncPruneBnB> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(**(long **)&(this->super_QFunctionJointBelief).field_0x8 + 0x30))(&local_30);
  std::operator+(__return_storage_ptr__,"QAV",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrintBrief() const { return("QAV" + _m_p->SoftPrintBrief()); }